

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int libssh2_session_handshake(LIBSSH2_SESSION *session,libssh2_socket_t sock)

{
  int iVar1;
  time_t start_time;
  time_t entry_time;
  int rc;
  libssh2_socket_t sock_local;
  LIBSSH2_SESSION *session_local;
  
  start_time = time((time_t *)0x0);
  while( true ) {
    iVar1 = session_startup(session,sock);
    if (iVar1 != -0x25) {
      return iVar1;
    }
    if (session->api_block_mode == 0) break;
    iVar1 = _libssh2_wait_socket(session,start_time);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  return -0x25;
}

Assistant:

LIBSSH2_API int
libssh2_session_handshake(LIBSSH2_SESSION *session, libssh2_socket_t sock)
{
    int rc;

    BLOCK_ADJUST(rc, session, session_startup(session, sock));

    return rc;
}